

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t,duckdb::BinaryStandardOperatorWrapper,duckdb::GreatestCommonDivisorOperator,bool,false,false>
               (hugeint_t *ldata,hugeint_t *rdata,hugeint_t *result_data,idx_t count,
               ValidityMask *mask,bool fun)

{
  ulong uVar1;
  unsigned_long *puVar2;
  hugeint_t right;
  hugeint_t right_00;
  hugeint_t left;
  hugeint_t left_00;
  hugeint_t left_01;
  uint64_t unaff_RBX;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  int64_t unaff_R12;
  ulong uVar8;
  ulong uVar9;
  hugeint_t hVar10;
  uint64_t in_stack_ffffffffffffffa0;
  ulong uVar11;
  int64_t in_stack_ffffffffffffffa8;
  idx_t iVar12;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      lVar5 = 8;
      do {
        left_01.upper = unaff_R12;
        left_01.lower = unaff_RBX;
        hVar10.upper = in_stack_ffffffffffffffa8;
        hVar10.lower = in_stack_ffffffffffffffa0;
        hVar10 = GreatestCommonDivisor<duckdb::hugeint_t>(left_01,hVar10);
        *(uint64_t *)((long)result_data + lVar5 + -8) = hVar10.lower;
        *(int64_t *)((long)&result_data->lower + lVar5) = hVar10.upper;
        lVar5 = lVar5 + 0x10;
        count = count - 1;
      } while (count != 0);
    }
  }
  else {
    uVar1 = count + 0x3f;
    if (0x3f < uVar1) {
      uVar11 = 0;
      uVar7 = 0;
      iVar12 = count;
      do {
        puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (puVar2 == (unsigned_long *)0x0) {
          uVar3 = uVar7 + 0x40;
          if (count <= uVar7 + 0x40) {
            uVar3 = count;
          }
LAB_01add447:
          uVar4 = uVar7;
          if (uVar7 < uVar3) {
            uVar9 = uVar7 << 4 | 8;
            count = iVar12;
            do {
              left_00.upper = unaff_R12;
              left_00.lower = unaff_RBX;
              right_00.upper = count;
              right_00.lower = uVar11;
              hVar10 = GreatestCommonDivisor<duckdb::hugeint_t>(left_00,right_00);
              *(uint64_t *)((long)result_data + (uVar9 - 8)) = hVar10.lower;
              *(int64_t *)((long)&result_data->lower + uVar9) = hVar10.upper;
              uVar7 = uVar7 + 1;
              uVar9 = uVar9 + 0x10;
              uVar4 = uVar3;
              iVar12 = count;
            } while (uVar3 != uVar7);
          }
        }
        else {
          uVar9 = puVar2[uVar11];
          uVar3 = uVar7 + 0x40;
          if (count <= uVar7 + 0x40) {
            uVar3 = count;
          }
          uVar4 = uVar3;
          if (uVar9 != 0) {
            if (uVar9 == 0xffffffffffffffff) goto LAB_01add447;
            uVar4 = uVar7;
            if (uVar7 < uVar3) {
              uVar6 = uVar7 << 4 | 8;
              uVar8 = 0;
              count = iVar12;
              do {
                if ((uVar9 >> (uVar8 & 0x3f) & 1) != 0) {
                  left.upper = unaff_R12;
                  left.lower = unaff_RBX;
                  right.upper = count;
                  right.lower = uVar11;
                  hVar10 = GreatestCommonDivisor<duckdb::hugeint_t>(left,right);
                  *(uint64_t *)((long)result_data + (uVar6 - 8)) = hVar10.lower;
                  *(int64_t *)((long)&result_data->lower + uVar6) = hVar10.upper;
                }
                uVar8 = uVar8 + 1;
                uVar6 = uVar6 + 0x10;
                uVar4 = uVar3;
                iVar12 = count;
              } while (uVar3 - uVar7 != uVar8);
            }
          }
        }
        uVar11 = uVar11 + 1;
        uVar7 = uVar4;
      } while (uVar11 != uVar1 >> 6);
    }
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}